

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O1

void __thiscall Imf_2_5::InputFile::readPixels(InputFile *this,int scanLine1,int scanLine2)

{
  uint uVar1;
  uint uVar2;
  pthread_mutex_t *__mutex;
  Data *pDVar3;
  TiledInputFile *this_00;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  char *pcVar7;
  size_t sVar8;
  size_t sVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  iterator iVar17;
  iterator iVar18;
  Slice *pSVar19;
  char *pcVar20;
  Iterator IVar21;
  ArgExc *this_01;
  int iVar22;
  long lVar23;
  long lVar24;
  _Rb_tree_color *p_Var25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  ulong uVar32;
  ulong uVar33;
  int iVar34;
  ulong uVar35;
  _Rb_tree_color *p_Var36;
  bool bVar37;
  Box2i levelRange;
  TiledInputFile local_50;
  TiledInputFile local_40;
  
  __mutex = (pthread_mutex_t *)this->_data;
  if ((CompositeDeepScanLine *)__mutex[5].__align != (CompositeDeepScanLine *)0x0) {
    CompositeDeepScanLine::readPixels
              ((CompositeDeepScanLine *)__mutex[5].__align,scanLine1,scanLine2);
    return;
  }
  if (*(char *)((long)__mutex + 100) != '\x01') {
    ScanLineInputFile::readPixels(*(ScanLineInputFile **)((long)__mutex + 0x70),scanLine1,scanLine2)
    ;
    return;
  }
  iVar11 = pthread_mutex_lock(__mutex);
  if (iVar11 != 0) {
    std::__throw_system_error(iVar11);
  }
  iVar11 = scanLine2;
  uVar10 = scanLine1;
  if (scanLine2 < scanLine1) {
    iVar11 = scanLine1;
    uVar10 = scanLine2;
  }
  pDVar3 = this->_data;
  iVar34 = pDVar3->minY;
  if (((int)uVar10 < iVar34) || (pDVar3->maxY < iVar11)) {
    this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc
              (this_01,"Tried to read scan line outside the image file\'s data window.");
    __cxa_throw(this_01,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  uVar12 = TiledInputFile::tileYSize(pDVar3->tFile);
  iVar22 = pDVar3->minY;
  uVar13 = TiledInputFile::tileYSize(pDVar3->tFile);
  uVar32 = (ulong)(uVar10 - iVar34) / (ulong)uVar12;
  uVar33 = (ulong)(uint)(iVar11 - iVar22) / (ulong)uVar13;
  bVar37 = pDVar3->lineOrder != DECREASING_Y;
  uVar35 = uVar32;
  uVar12 = (int)uVar33 + 1;
  if (!bVar37) {
    uVar35 = uVar33;
    uVar12 = (int)uVar32 - 1;
  }
  TiledInputFile::dataWindowForLevel(&local_40,(int)pDVar3->tFile);
  if ((uint)uVar35 != uVar12) {
    lVar23 = (long)scanLine1;
    if ((long)scanLine2 < (long)scanLine1) {
      lVar23 = (long)scanLine2;
    }
    do {
      iVar34 = (int)uVar35;
      TiledInputFile::dataWindowForTile(&local_50,(int)pDVar3->tFile,0,iVar34);
      lVar24 = (long)(int)local_50.super_GenericInputFile._vptr_GenericInputFile._4_4_;
      uVar13 = local_50.super_GenericInputFile._vptr_GenericInputFile._4_4_;
      if ((int)local_50.super_GenericInputFile._vptr_GenericInputFile._4_4_ < (int)uVar10) {
        uVar13 = uVar10;
      }
      iVar22 = local_50._data._4_4_;
      if (iVar11 <= local_50._data._4_4_) {
        iVar22 = iVar11;
      }
      if (iVar34 != pDVar3->cachedTileY) {
        this_00 = pDVar3->tFile;
        iVar14 = TiledInputFile::numXTiles(this_00,0);
        TiledInputFile::readTiles(this_00,0,iVar14 + -1,iVar34,iVar34,0);
        pDVar3->cachedTileY = iVar34;
      }
      iVar17._M_node = (_Base_ptr)FrameBuffer::begin(pDVar3->cachedBuffer);
      iVar18._M_node = (_Base_ptr)FrameBuffer::end(pDVar3->cachedBuffer);
      if (iVar17._M_node != iVar18._M_node) {
        if (lVar24 < lVar23) {
          lVar24 = lVar23;
        }
        do {
          p_Var4 = iVar17._M_node[9]._M_parent;
          p_Var5 = iVar17._M_node[9]._M_left;
          p_Var6 = iVar17._M_node[9]._M_right;
          pSVar19 = FrameBuffer::operator[](&pDVar3->tFileBuffer,(char *)(iVar17._M_node + 1));
          pcVar7 = pSVar19->base;
          sVar8 = pSVar19->xStride;
          sVar9 = pSVar19->yStride;
          uVar1 = pSVar19->xSampling;
          uVar2 = pSVar19->ySampling;
          uVar15 = pixelTypeSize(pSVar19->type);
          uVar32 = (ulong)(int)(uint)local_40.super_GenericInputFile._vptr_GenericInputFile;
          uVar27 = -uVar1;
          p_Var36 = (_Rb_tree_color *)((long)&p_Var4->_M_color + (uVar32 - 1) * (long)p_Var5);
          uVar26 = ~(uint)local_40.super_GenericInputFile._vptr_GenericInputFile;
          do {
            uVar30 = (uint)uVar32;
            if ((int)uVar30 < 0) {
              if (-1 < (int)uVar1) {
                uVar28 = (uVar1 + uVar26) / uVar1;
                goto LAB_001b1e22;
              }
              uVar28 = (uVar27 + uVar26) / uVar27;
            }
            else if ((int)uVar1 < 0) {
              uVar28 = (uint)((uVar32 & 0xffffffff) / (ulong)uVar27);
LAB_001b1e22:
              uVar28 = -uVar28;
            }
            else {
              uVar28 = (uint)((uVar32 & 0xffffffff) / (ulong)uVar1);
            }
            uVar31 = uVar30 + 1;
            uVar32 = (ulong)uVar31;
            p_Var36 = (_Rb_tree_color *)((long)&p_Var5->_M_color + (long)p_Var36);
            uVar26 = uVar26 - 1;
          } while (uVar30 != uVar1 * uVar28);
          uVar26 = -uVar2;
          uVar28 = ~uVar13 + uVar2;
          uVar29 = ~uVar13 - uVar2;
          uVar32 = lVar24 - 1;
          do {
            uVar32 = uVar32 + 1;
            iVar14 = (int)uVar32;
            if (iVar14 < 0) {
              if (-1 < (int)uVar2) {
                uVar16 = uVar28 / uVar2;
                goto LAB_001b1e93;
              }
              uVar16 = uVar29 / uVar26;
            }
            else if ((int)uVar2 < 0) {
              uVar16 = (uint)((uVar32 & 0xffffffff) / (ulong)uVar26);
LAB_001b1e93:
              uVar16 = -uVar16;
            }
            else {
              uVar16 = (uint)((uVar32 & 0xffffffff) / (ulong)uVar2);
            }
            uVar28 = uVar28 - 1;
            uVar29 = uVar29 - 1;
          } while (iVar14 != uVar2 * uVar16);
          if (iVar14 <= iVar22) {
            do {
              uVar28 = (uint)uVar32;
              if ((int)uVar28 < 0) {
                if (-1 < (int)uVar2) {
                  uVar29 = (~uVar28 + uVar2) / uVar2;
                  goto LAB_001b1f05;
                }
                uVar29 = (~uVar2 - uVar28) / uVar26;
              }
              else if ((int)uVar2 < 0) {
                uVar29 = (uint)((uVar32 & 0xffffffff) / (ulong)uVar26);
LAB_001b1f05:
                uVar29 = -uVar29;
              }
              else {
                uVar29 = (uint)((uVar32 & 0xffffffff) / (ulong)uVar2);
              }
              if ((int)uVar30 < 0) {
                if (-1 < (int)uVar1) {
                  uVar16 = (uVar1 - uVar31) / uVar1;
                  goto LAB_001b1f42;
                }
                uVar16 = (uVar27 - uVar31) / uVar27;
              }
              else if ((int)uVar1 < 0) {
                uVar16 = uVar30 / uVar27;
LAB_001b1f42:
                uVar16 = -uVar16;
              }
              else {
                uVar16 = uVar30 / uVar1;
              }
              if ((int)uVar30 <= (int)local_40._data) {
                p_Var25 = (_Rb_tree_color *)
                          ((long)p_Var36 +
                          (uVar32 - (long)(int)local_50.super_GenericInputFile.
                                               _vptr_GenericInputFile._4_4_) * (long)p_Var6);
                pcVar20 = pcVar7 + (long)(int)uVar16 * sVar8 + (long)(int)uVar29 * sVar9;
                uVar29 = uVar30;
                do {
                  if (0 < (int)uVar15) {
                    uVar33 = 0;
                    do {
                      pcVar20[uVar33] = *(char *)((long)p_Var25 + uVar33);
                      uVar33 = uVar33 + 1;
                    } while (uVar15 != uVar33);
                  }
                  p_Var25 = (_Rb_tree_color *)((long)p_Var25 + (long)p_Var5 * (long)(int)uVar1);
                  pcVar20 = pcVar20 + sVar8;
                  uVar29 = uVar29 + uVar1;
                } while ((int)uVar29 <= (int)local_40._data);
              }
              uVar32 = uVar32 + (long)(int)uVar2;
            } while ((int)(uVar28 + uVar2) <= iVar22);
          }
          iVar17._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar17._M_node);
          IVar21 = FrameBuffer::end(pDVar3->cachedBuffer);
        } while ((iterator)iVar17._M_node != IVar21._i._M_node);
      }
      uVar13 = iVar34 + (uint)bVar37 * 2 + -1;
      uVar35 = (ulong)uVar13;
    } while (uVar13 != uVar12);
  }
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void
InputFile::readPixels (int scanLine1, int scanLine2)
{
    if (_data->compositor)
    {
        _data->compositor->readPixels(scanLine1,scanLine2);
    }
    else if (_data->isTiled)
    {
	Lock lock (*_data);
        bufferedReadPixels (_data, scanLine1, scanLine2);
    }
    else
    {
        _data->sFile->readPixels (scanLine1, scanLine2);
    }
}